

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<unsigned_int,_sptk::int24_t>::Run
          (DataTransform<unsigned_int,_sptk::int24_t> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  int24_t *piVar3;
  int iVar4;
  int iVar5;
  int24_t *piVar6;
  ostream *poVar7;
  uint8_t *puVar8;
  size_t *__idx;
  uint8_t *puVar9;
  uint8_t uVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t uVar13;
  bool bVar14;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  uint input_data;
  int24_t local_2aa;
  int24_t local_2a7;
  ushort local_2a4;
  allocator local_2a1;
  int24_t *local_2a0;
  int24_t *local_298;
  uint8_t *local_290;
  uint8_t *local_288;
  uint8_t *local_280;
  uint8_t *local_278;
  ulong local_270;
  istream *local_268;
  string *local_260;
  long local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_298 = &this->minimum_value_;
  local_2a0 = &this->maximum_value_;
  local_288 = (this->maximum_value_).value + 1;
  local_290 = (this->maximum_value_).value + 2;
  local_278 = (this->minimum_value_).value + 1;
  local_280 = (this->minimum_value_).value + 2;
  local_260 = &this->print_format_;
  uVar12 = 0;
  local_268 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar14 = word._M_string_length == 0;
      if (!bVar14) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_2a4 = in_FPUControlWord | 0xc00;
        local_258 = (long)ROUND(in_ST0);
        input_data = (uint)local_258;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar14) goto LAB_00129308;
      if (bVar14) {
        if (bVar14) {
LAB_001295bc:
          bVar14 = true;
          if ((this->is_ascii_output_ == true) && ((int)uVar12 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_001295de:
          bVar14 = false;
        }
        return bVar14;
      }
    }
    else {
      bVar14 = sptk::ReadStream<unsigned_int>(&input_data,input_stream);
      if (!bVar14) goto LAB_001295bc;
LAB_00129308:
      uVar11 = input_data;
      local_270 = uVar12;
      iVar4 = sptk::int24_t::operator_cast_to_int(local_298);
      iVar5 = sptk::int24_t::operator_cast_to_int(local_2a0);
      piVar6 = local_298;
      if (iVar5 <= iVar4) goto LAB_00129489;
      NVar1 = this->input_numeric_type_;
      if (NVar1 == kFloatingPoint) {
LAB_00129346:
        uVar12 = (ulong)input_data;
        iVar4 = sptk::int24_t::operator_cast_to_int(local_298);
        piVar3 = local_2a0;
        puVar8 = local_278;
        puVar9 = local_280;
        if (((long)iVar4 <= (long)uVar12) &&
           (iVar4 = sptk::int24_t::operator_cast_to_int(local_2a0), piVar6 = piVar3,
           puVar8 = local_288, puVar9 = local_290, (long)(ulong)input_data <= (long)iVar4))
        goto LAB_00129489;
LAB_001293fa:
        uVar13 = *puVar9;
        uVar10 = *puVar8;
        uVar11 = (uint)piVar6->value[0];
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&word,(int)local_270);
          std::operator<<(poVar7,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_2a1);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          input_stream = local_268;
          if (WVar2 == kExit) goto LAB_001295de;
        }
      }
      else {
        if (NVar1 == kUnsignedInteger) {
          uVar12 = (ulong)input_data;
          iVar4 = sptk::int24_t::operator_cast_to_int(local_298);
          piVar3 = local_2a0;
          puVar8 = local_278;
          puVar9 = local_280;
          if ((uVar12 < (ulong)(long)iVar4) ||
             (iVar4 = sptk::int24_t::operator_cast_to_int(local_2a0), piVar6 = piVar3,
             puVar8 = local_288, puVar9 = local_290, (ulong)(long)iVar4 < (ulong)input_data))
          goto LAB_001293fa;
        }
        else if (NVar1 == kSignedInteger) goto LAB_00129346;
LAB_00129489:
        if (this->rounding_ == true) {
          if (input_data == 0) {
            uVar13 = '\0';
            uVar10 = '\0';
            uVar11 = 0;
            goto LAB_001294bc;
          }
          uVar11 = (uint)((double)input_data + 0.5);
        }
        uVar10 = (uint8_t)(uVar11 >> 8);
        uVar13 = (uint8_t)(uVar11 >> 0x10);
      }
LAB_001294bc:
      if (this->is_ascii_output_ == true) {
        local_2a7.value[0] = (uint8_t)uVar11;
        local_2a7.value[1] = uVar10;
        local_2a7.value[2] = uVar13;
        bVar14 = sptk::SnPrintf<sptk::int24_t>(&local_2a7,local_260,0x80,buffer);
        if (!bVar14) goto LAB_001295de;
        std::operator<<((ostream *)&std::cout,buffer);
        if (((int)local_270 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          uVar12 = local_270;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          uVar12 = local_270;
        }
      }
      else {
        local_2aa.value[0] = (uint8_t)uVar11;
        local_2aa.value[1] = uVar10;
        local_2aa.value[2] = uVar13;
        bVar14 = sptk::WriteStream<sptk::int24_t>(&local_2aa,(ostream *)&std::cout);
        uVar12 = local_270;
        if (!bVar14) goto LAB_001295de;
      }
    }
    uVar12 = (ulong)((int)uVar12 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }